

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  int in_R9D;
  int in_stack_fffffffffffff908;
  bench_inv data;
  
  pcVar3 = getenv("SECP256K1_BENCH_ITERS");
  if (pcVar3 == (char *)0x0) {
    uVar4 = 20000;
  }
  else {
    uVar4 = strtol(pcVar3,(char **)0x0,0);
  }
  if ((1 < argc) &&
     (((iVar1 = have_flag(argc,argv,"-h"), iVar1 != 0 ||
       (iVar1 = have_flag(argc,argv,"--help"), iVar1 != 0)) ||
      (iVar1 = have_flag(argc,argv,"help"), iVar1 != 0)))) {
    puts("Benchmarks various internal routines.");
    putchar(10);
    printf("The default number of iterations for each benchmark is %d. This can be\n",20000);
    puts("customized using the SECP256K1_BENCH_ITERS environment variable.");
    putchar(10);
    puts("Usage: ./bench_internal [args]");
    puts("By default, all benchmarks will be run.");
    puts("args:");
    puts("    help       : display this help and exit");
    puts("    scalar     : all scalar operations (add, half, inverse, mul, negate, split)");
    puts(
        "    field      : all field operations (half, inverse, issquare, mul, normalize, sqr, sqrt)"
        );
    puts("    group      : all group operations (add, double, to_affine)");
    puts("    ecmult     : all point multiplication operations (ecmult_wnaf) ");
    puts("    hash       : all hash algorithms (hmac, rng6979, sha256)");
    puts("    context    : all context object operations (context_create)");
    putchar(10);
    return 0;
  }
  pcVar3 = "    Max(us)    ";
  printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ");
  putchar(10);
  iVar1 = (int)uVar4;
  if (argc == 1) {
    run_benchmark("scalar_half",bench_scalar_half,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 100),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
LAB_0010ca61:
    run_benchmark("scalar_add",bench_scalar_add,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 100),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
    if (argc != 1) goto LAB_0010caa2;
    run_benchmark("scalar_negate",bench_scalar_negate,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 100),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
LAB_0010cb12:
    run_benchmark("scalar_mul",bench_scalar_mul,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
    if (argc != 1) goto LAB_0010cb50;
    run_benchmark("scalar_split",bench_scalar_split,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
LAB_0010cbbf:
    run_benchmark("scalar_inverse",bench_scalar_inverse,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
    if (argc != 1) goto LAB_0010cbfc;
    run_benchmark("scalar_inverse_var",bench_scalar_inverse_var,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
LAB_0010cc6b:
    run_benchmark("field_half",bench_field_half,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 100),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
    if (argc != 1) goto LAB_0010ccac;
    run_benchmark("field_normalize",bench_field_normalize,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 100),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
LAB_0010cd1c:
    run_benchmark("field_normalize_weak",bench_field_normalize_weak,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 100),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
    if (argc != 1) goto LAB_0010cd5b;
    run_benchmark("field_sqr",bench_field_sqr,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
LAB_0010cdcb:
    run_benchmark("field_mul",bench_field_mul,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
    if (argc != 1) goto LAB_0010ce09;
    run_benchmark("field_inverse",bench_field_inverse,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
LAB_0010ce78:
    run_benchmark("field_inverse_var",bench_field_inverse_var,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
    if (argc != 1) goto LAB_0010ceb5;
    run_benchmark("field_is_square_var",bench_field_is_square_var,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
LAB_0010cf24:
    run_benchmark("field_sqrt",bench_field_sqrt,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
    if (argc != 1) goto LAB_0010cf62;
    run_benchmark("group_double_var",bench_group_double_var,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
LAB_0010cfd2:
    run_benchmark("group_add_var",bench_group_add_var,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
    if (argc != 1) goto LAB_0010d013;
    run_benchmark("group_add_affine",bench_group_add_affine,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
LAB_0010d083:
    run_benchmark("group_add_affine_var",bench_group_add_affine_var,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
    if (argc != 1) goto LAB_0010d0c4;
    run_benchmark("group_add_zinv_var",bench_group_add_zinv_var,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
LAB_0010d134:
    run_benchmark("group_to_affine_var",bench_group_to_affine_var,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
    if (argc != 1) goto LAB_0010d171;
    run_benchmark("ecmult_wnaf",bench_ecmult_wnaf,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
LAB_0010d1e0:
    run_benchmark("hash_sha256",bench_sha256,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
    if (argc != 1) goto LAB_0010d21d;
    run_benchmark("hash_hmac_sha256",bench_hmac_sha256,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
LAB_0010d28c:
    run_benchmark("hash_rfc6979_hmac_sha256",bench_rfc6979_hmac_sha256,(_func_void_void_ptr *)&data,
                  (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                  in_stack_fffffffffffff908);
    if (argc == 1) goto LAB_0010d2c1;
  }
  else {
    iVar2 = have_flag(argc,argv,"scalar");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"half"), iVar2 != 0)) {
      run_benchmark("scalar_half",bench_scalar_half,(_func_void_void_ptr *)&data,
                    (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 100),pcVar3,in_R9D,
                    in_stack_fffffffffffff908);
    }
    iVar2 = have_flag(argc,argv,"scalar");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"add"), iVar2 != 0)) goto LAB_0010ca61;
LAB_0010caa2:
    iVar2 = have_flag(argc,argv,"scalar");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"negate"), iVar2 != 0)) {
      run_benchmark("scalar_negate",bench_scalar_negate,(_func_void_void_ptr *)&data,
                    (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 100),pcVar3,in_R9D,
                    in_stack_fffffffffffff908);
    }
    iVar2 = have_flag(argc,argv,"scalar");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"mul"), iVar2 != 0)) goto LAB_0010cb12;
LAB_0010cb50:
    iVar2 = have_flag(argc,argv,"scalar");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"split"), iVar2 != 0)) {
      run_benchmark("scalar_split",bench_scalar_split,(_func_void_void_ptr *)&data,
                    (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                    in_stack_fffffffffffff908);
    }
    iVar2 = have_flag(argc,argv,"scalar");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"inverse"), iVar2 != 0)) goto LAB_0010cbbf;
LAB_0010cbfc:
    iVar2 = have_flag(argc,argv,"scalar");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"inverse"), iVar2 != 0)) {
      run_benchmark("scalar_inverse_var",bench_scalar_inverse_var,(_func_void_void_ptr *)&data,
                    (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                    in_stack_fffffffffffff908);
    }
    iVar2 = have_flag(argc,argv,"field");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"half"), iVar2 != 0)) goto LAB_0010cc6b;
LAB_0010ccac:
    iVar2 = have_flag(argc,argv,"field");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"normalize"), iVar2 != 0)) {
      run_benchmark("field_normalize",bench_field_normalize,(_func_void_void_ptr *)&data,
                    (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 100),pcVar3,in_R9D,
                    in_stack_fffffffffffff908);
    }
    iVar2 = have_flag(argc,argv,"field");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"normalize"), iVar2 != 0)) goto LAB_0010cd1c;
LAB_0010cd5b:
    iVar2 = have_flag(argc,argv,"field");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"sqr"), iVar2 != 0)) {
      run_benchmark("field_sqr",bench_field_sqr,(_func_void_void_ptr *)&data,
                    (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                    in_stack_fffffffffffff908);
    }
    iVar2 = have_flag(argc,argv,"field");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"mul"), iVar2 != 0)) goto LAB_0010cdcb;
LAB_0010ce09:
    iVar2 = have_flag(argc,argv,"field");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"inverse"), iVar2 != 0)) {
      run_benchmark("field_inverse",bench_field_inverse,(_func_void_void_ptr *)&data,
                    (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                    in_stack_fffffffffffff908);
    }
    iVar2 = have_flag(argc,argv,"field");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"inverse"), iVar2 != 0)) goto LAB_0010ce78;
LAB_0010ceb5:
    iVar2 = have_flag(argc,argv,"field");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"issquare"), iVar2 != 0)) {
      run_benchmark("field_is_square_var",bench_field_is_square_var,(_func_void_void_ptr *)&data,
                    (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                    in_stack_fffffffffffff908);
    }
    iVar2 = have_flag(argc,argv,"field");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"sqrt"), iVar2 != 0)) goto LAB_0010cf24;
LAB_0010cf62:
    iVar2 = have_flag(argc,argv,"group");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"double"), iVar2 != 0)) {
      run_benchmark("group_double_var",bench_group_double_var,(_func_void_void_ptr *)&data,
                    (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                    in_stack_fffffffffffff908);
    }
    iVar2 = have_flag(argc,argv,"group");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"add"), iVar2 != 0)) goto LAB_0010cfd2;
LAB_0010d013:
    iVar2 = have_flag(argc,argv,"group");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"add"), iVar2 != 0)) {
      run_benchmark("group_add_affine",bench_group_add_affine,(_func_void_void_ptr *)&data,
                    (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                    in_stack_fffffffffffff908);
    }
    iVar2 = have_flag(argc,argv,"group");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"add"), iVar2 != 0)) goto LAB_0010d083;
LAB_0010d0c4:
    iVar2 = have_flag(argc,argv,"group");
    if ((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"add"), iVar2 != 0)) {
      run_benchmark("group_add_zinv_var",bench_group_add_zinv_var,(_func_void_void_ptr *)&data,
                    (_func_void_void_ptr_int *)(ulong)(uint)(iVar1 * 10),pcVar3,in_R9D,
                    in_stack_fffffffffffff908);
    }
    iVar1 = have_flag(argc,argv,"group");
    if ((iVar1 != 0) || (iVar1 = have_flag(argc,argv,"to_affine"), iVar1 != 0)) goto LAB_0010d134;
LAB_0010d171:
    iVar1 = have_flag(argc,argv,"ecmult");
    if ((iVar1 != 0) || (iVar1 = have_flag(argc,argv,"wnaf"), iVar1 != 0)) {
      run_benchmark("ecmult_wnaf",bench_ecmult_wnaf,(_func_void_void_ptr *)&data,
                    (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                    in_stack_fffffffffffff908);
    }
    iVar1 = have_flag(argc,argv,"hash");
    if ((iVar1 != 0) || (iVar1 = have_flag(argc,argv,"sha256"), iVar1 != 0)) goto LAB_0010d1e0;
LAB_0010d21d:
    iVar1 = have_flag(argc,argv,"hash");
    if ((iVar1 != 0) || (iVar1 = have_flag(argc,argv,"hmac"), iVar1 != 0)) {
      run_benchmark("hash_hmac_sha256",bench_hmac_sha256,(_func_void_void_ptr *)&data,
                    (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                    in_stack_fffffffffffff908);
    }
    iVar1 = have_flag(argc,argv,"hash");
    if ((iVar1 != 0) || (iVar1 = have_flag(argc,argv,"rng6979"), iVar1 != 0)) goto LAB_0010d28c;
  }
  iVar1 = have_flag(argc,argv,"context");
  if (iVar1 == 0) {
    return 0;
  }
LAB_0010d2c1:
  run_benchmark("context_create",bench_context,(_func_void_void_ptr *)&data,
                (_func_void_void_ptr_int *)(uVar4 & 0xffffffff),pcVar3,in_R9D,
                in_stack_fffffffffffff908);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    bench_inv data;
    int default_iters = 20000;
    int iters = get_iters(default_iters);
    int d = argc == 1; /* default */

    if (argc > 1) {
        if (have_flag(argc, argv, "-h")
           || have_flag(argc, argv, "--help")
           || have_flag(argc, argv, "help")) {
            help(default_iters);
            return EXIT_SUCCESS;
        }
    }

    print_output_table_header_row();

    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "half")) run_benchmark("scalar_half", bench_scalar_half, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "add")) run_benchmark("scalar_add", bench_scalar_add, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "negate")) run_benchmark("scalar_negate", bench_scalar_negate, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "mul")) run_benchmark("scalar_mul", bench_scalar_mul, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "split")) run_benchmark("scalar_split", bench_scalar_split, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "inverse")) run_benchmark("scalar_inverse", bench_scalar_inverse, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "scalar") || have_flag(argc, argv, "inverse")) run_benchmark("scalar_inverse_var", bench_scalar_inverse_var, bench_setup, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "half")) run_benchmark("field_half", bench_field_half, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "normalize")) run_benchmark("field_normalize", bench_field_normalize, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "normalize")) run_benchmark("field_normalize_weak", bench_field_normalize_weak, bench_setup, NULL, &data, 10, iters*100);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "sqr")) run_benchmark("field_sqr", bench_field_sqr, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "mul")) run_benchmark("field_mul", bench_field_mul, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "inverse")) run_benchmark("field_inverse", bench_field_inverse, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "inverse")) run_benchmark("field_inverse_var", bench_field_inverse_var, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "issquare")) run_benchmark("field_is_square_var", bench_field_is_square_var, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "field") || have_flag(argc, argv, "sqrt")) run_benchmark("field_sqrt", bench_field_sqrt, bench_setup, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "double")) run_benchmark("group_double_var", bench_group_double_var, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "add")) run_benchmark("group_add_var", bench_group_add_var, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "add")) run_benchmark("group_add_affine", bench_group_add_affine, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "add")) run_benchmark("group_add_affine_var", bench_group_add_affine_var, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "add")) run_benchmark("group_add_zinv_var", bench_group_add_zinv_var, bench_setup, NULL, &data, 10, iters*10);
    if (d || have_flag(argc, argv, "group") || have_flag(argc, argv, "to_affine")) run_benchmark("group_to_affine_var", bench_group_to_affine_var, bench_setup, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "ecmult") || have_flag(argc, argv, "wnaf")) run_benchmark("ecmult_wnaf", bench_ecmult_wnaf, bench_setup, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "hash") || have_flag(argc, argv, "sha256")) run_benchmark("hash_sha256", bench_sha256, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "hash") || have_flag(argc, argv, "hmac")) run_benchmark("hash_hmac_sha256", bench_hmac_sha256, bench_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "hash") || have_flag(argc, argv, "rng6979")) run_benchmark("hash_rfc6979_hmac_sha256", bench_rfc6979_hmac_sha256, bench_setup, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "context")) run_benchmark("context_create", bench_context, bench_setup, NULL, &data, 10, iters);

    return EXIT_SUCCESS;
}